

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceTexture::RunIteration
          (BasicResourceTexture *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *buffers_00;
  pointer *ppVVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int i;
  GLuint GVar4;
  GLint location;
  uint uVar5;
  long lVar6;
  ostream *poVar7;
  pointer pVVar9;
  bool *compile_error;
  ulong extraout_RDX;
  int height;
  ulong uVar10;
  int width;
  int i_1;
  uint uVar11;
  int depth;
  bool bVar12;
  GLuint fbo;
  uvec3 *local_220;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texture_data;
  uvec3 global_size;
  float fStack_1ec;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer_data;
  ios_base local_138 [264];
  ulong uVar8;
  
  local_220 = num_groups;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  stack0xfffffffffffffe10 = stack0xfffffffffffffe10 & 0xffffffff00000000;
  global_size.m_data[0] = 0;
  global_size.m_data[1] = 0;
  lVar6 = 0;
  do {
    global_size.m_data[lVar6] = local_220->m_data[lVar6] * param_1->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer_data);
  ppVVar1 = &buffer_data.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppVVar1,"\nlayout(local_size_x = ",0x17);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)ppVVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", local_size_y = ",0x11);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", local_size_z = ",0x11);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,") in;\nconst uvec3 kGlobalSize = uvec3(",0x26);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             ");\nuniform sampler1D g_sampler0;\nuniform sampler2D g_sampler1;\nuniform sampler3D g_sampler2;\nuniform sampler2DRect g_sampler3;\nuniform sampler1DArray g_sampler4;\nuniform sampler2DArray g_sampler5;\nuniform samplerBuffer g_sampler6;\nuniform sampler2DMS g_sampler7;\nuniform sampler2DMSArray g_sampler8;\nlayout(std430) buffer OutputBuffer {\n  vec4 data0["
             ,0x15e);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];\n  vec4 data1[",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];\n  vec4 data2[",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];\n  vec4 data3[",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];\n  vec4 data4[",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];\n  vec4 data5[",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];\n  vec4 data6[",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];\n  vec4 data7[",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];\n  vec4 data8[",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "];\n} g_out_buffer;\nvoid main() {\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.data0[global_index] = texelFetch(g_sampler0, int(gl_GlobalInvocationID), 0);\n  g_out_buffer.data1[global_index] = texture(g_sampler1, vec2(gl_GlobalInvocationID) / vec2(kGlobalSize));\n  g_out_buffer.data2[global_index] = textureProj(g_sampler2, vec4(vec3(gl_GlobalInvocationID) / vec3(kGlobalSize), 1.0));\n  g_out_buffer.data3[global_index] = textureProjOffset(g_sampler3, vec3(vec2(gl_GlobalInvocationID), 1.0), ivec2(0));\n  g_out_buffer.data4[global_index] = textureLodOffset(g_sampler4, vec2(gl_GlobalInvocationID.x / kGlobalSize.x, gl_GlobalInvocationID.y), 0.0, 0);\n  g_out_buffer.data5[global_index] = texelFetchOffset(g_sampler5, ivec3(gl_GlobalInvocationID), 0, ivec2(0));\n  g_out_buffer.data6[global_index] = texelFetch(g_sampler6, int(global_index));\n  g_out_buffer.data7[global_index] = texelFetch(g_sampler7, ivec2(gl_GlobalInvocationID), 1);\n  g_out_buffer.data8[global_index] = texelFetch(g_sampler8, ivec3(gl_GlobalInvocationID), 2);\n}"
             ,0x4b7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer_data);
  std::ios_base::~ios_base(local_138);
  GVar4 = ComputeShaderBase::CreateComputeProgram
                    (&this->super_ComputeShaderBase,(string *)&texture_data);
  this->m_program = GVar4;
  if (texture_data.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&texture_data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(texture_data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(texture_data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
    GVar4 = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,GVar4);
  bVar3 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  bVar12 = false;
  if (bVar3) {
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    uVar8 = 0;
    do {
      sprintf((char *)&buffer_data,"g_sampler%d",uVar8);
      location = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,this->m_program,(GLchar *)&buffer_data);
      glu::CallLogWrapper::glUniform1i(this_00,location,(int)uVar8);
      uVar11 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar11;
    } while (uVar11 != 9);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    width = local_220->m_data[0] * param_1->m_data[0];
    height = local_220->m_data[1] * param_1->m_data[1];
    depth = local_220->m_data[2] * param_1->m_data[2];
    uVar5 = height * width * depth;
    uVar8 = (ulong)uVar5;
    uVar11 = uVar5 * 9;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&buffer_data,(ulong)uVar11,(allocator_type *)&texture_data);
    buffers = &this->m_storage_buffer;
    GVar4 = this->m_storage_buffer;
    if (GVar4 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
      GVar4 = *buffers;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar4);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,uVar8 * 0x90,
               buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    global_size.m_data[0] = 0x42f60000;
    global_size.m_data[1] = 0x42f60000;
    global_size.m_data[2] = 0x42f60000;
    fStack_1ec = 123.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&texture_data,uVar8,(value_type *)&global_size,(allocator_type *)&fbo);
    if (this->m_texture[0] == 0) {
      glu::CallLogWrapper::glGenTextures(this_00,9,this->m_texture);
    }
    buffers_00 = &this->m_texture_buffer;
    if (this->m_texture_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_00);
    }
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde0,this->m_texture[0]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage1D
              (this_00,0xde0,0,0x8814,width,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8814,width,height,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c2);
    glu::CallLogWrapper::glBindTexture(this_00,0x806f,this->m_texture[2]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x806f,0,0x8814,width,height,depth,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c3);
    glu::CallLogWrapper::glBindTexture(this_00,0x84f5,this->m_texture[3]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0x84f5,0,0x8814,width,height,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c4);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c18,this->m_texture[4]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0x8c18,0,0x8814,width,height,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c5);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->m_texture[5]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,0,0x8814,width,height,depth,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c6);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,*buffers_00);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8c2a,uVar8 * 0x10,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[6]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,*buffers_00);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c7);
    glu::CallLogWrapper::glBindTexture(this_00,0x9100,this->m_texture[7]);
    glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8814,width,height,'\0');
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c8);
    glu::CallLogWrapper::glBindTexture(this_00,0x9102,this->m_texture[8]);
    glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8814,width,height,depth,'\0');
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&fbo);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_texture[7],0);
    global_size.m_data[0] = 0x42f60000;
    global_size.m_data[1] = 0x42f60000;
    global_size.m_data[2] = 0x42f60000;
    fStack_1ec = 123.0;
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,(GLfloat *)&global_size);
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_texture[8],0);
    global_size.m_data[0] = 0x42f60000;
    global_size.m_data[1] = 0x42f60000;
    global_size.m_data[2] = 0x42f60000;
    fStack_1ec = 123.0;
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,(GLfloat *)&global_size);
    glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&fbo);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      GVar4 = this->m_dispatch_buffer;
      if (GVar4 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar4 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar4);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,local_220,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,local_220->m_data[0],local_220->m_data[1],local_220->m_data[2]);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData
              (this_00,0x90d2,0,uVar8 * 0x90,
               buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    if (uVar5 == 0) {
      bVar12 = true;
    }
    else {
      uVar10 = 0;
      bVar12 = false;
      pVVar9 = buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = extraout_RDX;
      do {
        auVar2._4_4_ = -(uint)(pVVar9->m_data[1] != 123.0);
        auVar2._0_4_ = -(uint)(pVVar9->m_data[0] != 123.0);
        auVar2._8_4_ = -(uint)(pVVar9->m_data[2] != 123.0);
        auVar2._12_4_ = -(uint)(pVVar9->m_data[3] != 123.0);
        uVar5 = movmskps((int)uVar8,auVar2);
        uVar8 = (ulong)uVar5;
        if (uVar5 != 0) {
          anon_unknown_0::Output("Incorrect data at index %d.\n");
          break;
        }
        uVar10 = uVar10 + 1;
        bVar12 = uVar11 <= (uint)uVar10;
        pVVar9 = pVVar9 + 1;
      } while (uVar11 + (uVar11 == 0) != uVar10);
    }
    if (texture_data.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(texture_data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)texture_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)texture_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (buffer_data.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(buffer_data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)buffer_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)buffer_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar12;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		glUseProgram(m_program);
		for (int i = 0; i < 9; ++i)
		{
			char name[32];
			sprintf(name, "g_sampler%d", i);
			glUniform1i(glGetUniformLocation(m_program, name), i);
		}
		glUseProgram(0);

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();
		const GLint kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());

		std::vector<vec4> buffer_data(kBufferSize * 9);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 9, &buffer_data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		std::vector<vec4> texture_data(kBufferSize, vec4(123.0f));
		if (m_texture[0] == 0)
			glGenTextures(9, m_texture);
		if (m_texture_buffer == 0)
			glGenBuffers(1, &m_texture_buffer);

		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_1D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage1D(GL_TEXTURE_1D, 0, GL_RGBA32F, kWidth, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE2);
		glBindTexture(GL_TEXTURE_3D, m_texture[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE3);
		glBindTexture(GL_TEXTURE_RECTANGLE, m_texture[3]);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_RECTANGLE, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE4);
		glBindTexture(GL_TEXTURE_1D_ARRAY, m_texture[4]);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_1D_ARRAY, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE5);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture[5]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT,
					 &texture_data[0]);

		glActiveTexture(GL_TEXTURE6);
		glBindBuffer(GL_TEXTURE_BUFFER, m_texture_buffer);
		glBufferData(GL_TEXTURE_BUFFER, kBufferSize * sizeof(vec4), &texture_data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[6]);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_texture_buffer);

		glActiveTexture(GL_TEXTURE7);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_texture[7]);
		glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, GL_RGBA32F, kWidth, kHeight, GL_FALSE);

		glActiveTexture(GL_TEXTURE8);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, m_texture[8]);
		glTexImage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 4, GL_RGBA32F, kWidth, kHeight, kDepth, GL_FALSE);

		// clear MS textures
		GLuint fbo;
		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture[7], 0);
		glClearBufferfv(GL_COLOR, 0, &vec4(123.0f)[0]);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture[8], 0);
		glClearBufferfv(GL_COLOR, 0, &vec4(123.0f)[0]);
		glDeleteFramebuffers(1, &fbo);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize * 9, &buffer_data[0]);
		for (GLuint index = 0; index < kBufferSize * 9; ++index)
		{
			if (!IsEqual(buffer_data[index], vec4(123.0f)))
			{
				Output("Incorrect data at index %d.\n", index);
				return false;
			}
		}
		return true;
	}